

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O3

void __thiscall NaNNUnit::FeedbackValues(NaNNUnit *this,NaReal *fb)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  NaReal *pNVar3;
  undefined4 *puVar4;
  uint uVar5;
  
  uVar5 = (uint)((ulong)in_RAX >> 0x20);
  if (fb != (NaReal *)0x0) {
    iVar1 = (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[0xb])();
    if (iVar1 != 0) {
      pNVar3 = NaVector::operator[](&this->feedback,0);
      iVar1 = (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[10])(this);
      iVar2 = (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[0xb])(this);
      (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[0x16])
                (this,&this->OutputScaler,&this->StdInputRange,fb,pNVar3,
                 (ulong)(uint)(iVar1 * iVar2),(ulong)uVar5 << 0x20);
    }
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

void
NaNNUnit::FeedbackValues (NaReal* fb)
{
    if(NULL == fb)
        throw(na_null_pointer);

    if(0 == FeedbackDepth())
        // No need for feedback values
        return;

#if 0
    unsigned    i, j;

    for(i = 0; i < FeedbackDepth(); ++i)
        for(j = 0; j < OutputDim(); ++j)
            feedback[i * OutputDim() + j] = fb[i * OutputDim() + j];
#endif

    // Scale output vector
    ScaleData(OutputScaler, StdInputRange, fb, &feedback[0],
              OutputDim() * FeedbackDepth());
}